

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_multipivot.cpp
# Opt level: O2

void multikey_multipivot<unsigned_short,32u>(uchar **strings,size_t n,size_t depth)

{
  ushort uVar1;
  uchar *puVar2;
  size_t n_00;
  size_t n_01;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined6 uVar19;
  uint16_t uVar20;
  void *__src;
  byte bVar21;
  uint i_1;
  ulong uVar22;
  ulong uVar23;
  size_t sVar24;
  ulong uVar25;
  unsigned_long uVar26;
  uint j;
  long lVar27;
  unsigned_long *__memptr;
  byte *pbVar28;
  long lVar29;
  byte *__ptr;
  size_t i_2;
  byte *pbVar30;
  int iVar31;
  uchar **ppuVar32;
  uint j_2;
  ushort uVar33;
  double dVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  undefined1 auVar35 [16];
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  char local_2e8;
  ushort uStack_2e6;
  ushort uStack_2e4;
  ushort uStack_2e2;
  ushort uStack_2e0;
  ushort uStack_2de;
  ushort uStack_2dc;
  ushort uStack_2da;
  vector<unsigned_short,_std::allocator<unsigned_short>_> sample_array;
  undefined8 local_2b8;
  ushort uStack_2b0;
  ushort uStack_2ae;
  ushort uStack_2ac;
  ushort uStack_2aa;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> sample;
  array<unsigned_short,_32UL> pivots;
  array<unsigned_long,_65UL> bucketsize;
  
  if (n < 15000) {
    mkqsort(strings,(int)n,(int)depth);
    return;
  }
  sample._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sample._M_t._M_impl.super__Rb_tree_header._M_header;
  sample._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sample._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sample._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar29 = n - 7;
  auVar35._8_4_ = (int)((ulong)lVar29 >> 0x20);
  auVar35._0_8_ = lVar29;
  auVar35._12_4_ = 0x45300000;
  sample._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sample._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (iVar31 = 0; iVar31 != 0x20; iVar31 = iVar31 + 1) {
    dVar34 = drand48();
    dVar34 = dVar34 * ((auVar35._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar29) - 4503599627370496.0));
    uVar22 = (ulong)dVar34;
    uVar22 = (long)(dVar34 - 9.223372036854776e+18) & (long)uVar22 >> 0x3f | uVar22;
    if (n <= uVar22 + 6) {
      __assert_fail("pos+6 < n",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                    ,0x180,
                    "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned short, Pivots = 32U]"
                   );
    }
    for (lVar27 = 0; lVar27 != 7; lVar27 = lVar27 + 1) {
      uVar20 = get_char<unsigned_short>(strings[uVar22 + lVar27],depth);
      *(uint16_t *)((long)bucketsize._M_elems + lVar27 * 2) = uVar20;
    }
    std::
    _Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
    ::_M_insert_range_unique<unsigned_short*>
              ((_Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
                *)&sample,(unsigned_short *)&bucketsize,
               (unsigned_short *)((long)bucketsize._M_elems + 0xe));
  }
  bucketsize._M_elems[0]._0_2_ = 1;
  while (sample._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x20) {
    if ((char)(ushort)bucketsize._M_elems[0] == '\0') {
      bucketsize._M_elems[0]._0_2_ = (ushort)bucketsize._M_elems[0] | 1;
    }
    std::
    _Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
    ::_M_insert_unique<unsigned_short_const&>
              ((_Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
                *)&sample,(unsigned_short *)&bucketsize);
    bucketsize._M_elems[0]._0_2_ = (ushort)bucketsize._M_elems[0] + 1;
  }
  std::vector<unsigned_short,std::allocator<unsigned_short>>::
  vector<std::_Rb_tree_const_iterator<unsigned_short>,void>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&sample_array,
             (_Rb_tree_const_iterator<unsigned_short>)
             sample._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<unsigned_short>)&sample._M_t._M_impl.super__Rb_tree_header,
             (allocator_type *)&bucketsize);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::clear(&sample._M_t);
  uVar22 = (ulong)((long)sample_array.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)sample_array.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 6;
  if ((int)uVar22 == 0) {
    __assert_fail("step > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                  ,0x191,
                  "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned short, Pivots = 32U]"
                 );
  }
  uVar25 = 0;
  for (lVar29 = 0; lVar29 != 0x20; lVar29 = lVar29 + 1) {
    pivots._M_elems[lVar29] =
         sample_array.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_start[uVar25 & 0xffffffff];
    uVar25 = uVar25 + uVar22;
  }
  __memptr = bucketsize._M_elems;
  iVar31 = posix_memalign((void **)__memptr,0x10,n);
  __ptr = (byte *)CONCAT62(bucketsize._M_elems[0]._2_6_,(ushort)bucketsize._M_elems[0]);
  for (lVar29 = 0; uVar19 = bucketsize._M_elems[0]._2_6_, uVar1 = (ushort)bucketsize._M_elems[0],
      lVar29 != 0x20; lVar29 = lVar29 + 1) {
    uVar1 = pivots._M_elems[lVar29];
    for (lVar27 = 0; lVar27 != 8; lVar27 = lVar27 + 1) {
      *(ushort *)((long)__memptr + lVar27 * 2) = uVar1 ^ 0x8000;
    }
    __memptr = __memptr + 2;
  }
  pbVar30 = (byte *)0x0;
  if (iVar31 != 0) {
    __ptr = pbVar30;
  }
  pbVar28 = (byte *)(n & 0xfffffffffffffff0);
  ppuVar32 = strings;
  for (; pbVar30 < pbVar28; pbVar30 = pbVar30 + 8) {
    for (lVar29 = 0; lVar29 != 8; lVar29 = lVar29 + 1) {
      uVar20 = get_char<unsigned_short>(ppuVar32[lVar29],depth);
      *(uint16_t *)((long)&local_2b8 + lVar29 * 2) = uVar20;
    }
    uVar43 = (ushort)local_2b8 ^ 0x8000;
    uVar44 = local_2b8._2_2_ ^ 0x8000;
    uVar45 = local_2b8._4_2_ ^ 0x8000;
    uVar46 = local_2b8._6_2_ ^ 0x8000;
    uVar47 = uStack_2b0 ^ 0x8000;
    uVar48 = uStack_2ae ^ 0x8000;
    uVar49 = uStack_2ac ^ 0x8000;
    uVar50 = uStack_2aa ^ 0x8000;
    uVar53 = 0;
    uVar55 = 0;
    uVar57 = 0;
    uVar59 = 0;
    uVar61 = 0;
    uVar63 = 0;
    uVar65 = 0;
    uVar67 = 0;
    lVar29 = 0x10;
    uStack_2e6 = (ushort)uVar19;
    uStack_2e4 = (ushort)((uint6)uVar19 >> 0x10);
    uStack_2e2 = (ushort)((uint6)uVar19 >> 0x20);
    uStack_2e0 = (ushort)bucketsize._M_elems[1];
    uStack_2de = (ushort)(bucketsize._M_elems[1] >> 0x10);
    uStack_2dc = (ushort)(bucketsize._M_elems[1] >> 0x20);
    uStack_2da = (ushort)(bucketsize._M_elems[1] >> 0x30);
    uVar33 = 1;
    uVar36 = 1;
    uVar37 = 1;
    uVar38 = 1;
    uVar39 = 1;
    uVar40 = 1;
    uVar41 = 1;
    uVar42 = 1;
    uVar51 = uVar1;
    while( true ) {
      bVar3 = uVar43 == uVar51;
      bVar4 = uVar44 == uStack_2e6;
      bVar5 = uVar45 == uStack_2e4;
      bVar6 = uVar46 == uStack_2e2;
      bVar7 = uVar47 == uStack_2e0;
      bVar8 = uVar48 == uStack_2de;
      bVar9 = uVar49 == uStack_2dc;
      bVar10 = uVar50 == uStack_2da;
      uVar68 = uVar33 + 1;
      uVar69 = uVar36 + 1;
      uVar70 = uVar37 + 1;
      uVar71 = uVar38 + 1;
      uVar72 = uVar39 + 1;
      uVar73 = uVar40 + 1;
      uVar74 = uVar41 + 1;
      uVar75 = uVar42 + 1;
      bVar11 = (short)uVar51 < (short)uVar43;
      bVar12 = (short)uStack_2e6 < (short)uVar44;
      bVar13 = (short)uStack_2e4 < (short)uVar45;
      bVar14 = (short)uStack_2e2 < (short)uVar46;
      bVar15 = (short)uStack_2e0 < (short)uVar47;
      bVar16 = (short)uStack_2de < (short)uVar48;
      bVar17 = (short)uStack_2dc < (short)uVar49;
      bVar18 = (short)uStack_2da < (short)uVar50;
      if (lVar29 == 0x200) break;
      uVar51 = *(ushort *)((long)bucketsize._M_elems + lVar29);
      uStack_2e6 = *(ushort *)((long)bucketsize._M_elems + lVar29 + 2);
      uStack_2e4 = *(ushort *)((long)bucketsize._M_elems + lVar29 + 4);
      uStack_2e2 = *(ushort *)((long)bucketsize._M_elems + lVar29 + 6);
      uStack_2e0 = *(ushort *)((long)bucketsize._M_elems + lVar29 + 8);
      uStack_2de = *(ushort *)((long)bucketsize._M_elems + lVar29 + 10);
      uStack_2dc = *(ushort *)((long)bucketsize._M_elems + lVar29 + 0xc);
      uStack_2da = *(ushort *)((long)bucketsize._M_elems + lVar29 + 0xe);
      uVar52 = -(ushort)bVar3 & uVar33;
      uVar54 = -(ushort)bVar4 & uVar36;
      uVar56 = -(ushort)bVar5 & uVar37;
      uVar58 = -(ushort)bVar6 & uVar38;
      uVar60 = -(ushort)bVar7 & uVar39;
      uVar62 = -(ushort)bVar8 & uVar40;
      uVar64 = -(ushort)bVar9 & uVar41;
      uVar66 = -(ushort)bVar10 & uVar42;
      uVar33 = uVar33 + 2;
      uVar36 = uVar36 + 2;
      uVar37 = uVar37 + 2;
      uVar38 = uVar38 + 2;
      uVar39 = uVar39 + 2;
      uVar40 = uVar40 + 2;
      uVar41 = uVar41 + 2;
      uVar42 = uVar42 + 2;
      uVar53 = uVar52 | uVar53 | -(ushort)bVar11 & uVar68 & -(ushort)((short)uVar43 < (short)uVar51)
      ;
      uVar55 = uVar54 | uVar55 |
               -(ushort)bVar12 & uVar69 & -(ushort)((short)uVar44 < (short)uStack_2e6);
      uVar57 = uVar56 | uVar57 |
               -(ushort)bVar13 & uVar70 & -(ushort)((short)uVar45 < (short)uStack_2e4);
      uVar59 = uVar58 | uVar59 |
               -(ushort)bVar14 & uVar71 & -(ushort)((short)uVar46 < (short)uStack_2e2);
      uVar61 = uVar60 | uVar61 |
               -(ushort)bVar15 & uVar72 & -(ushort)((short)uVar47 < (short)uStack_2e0);
      uVar63 = uVar62 | uVar63 |
               -(ushort)bVar16 & uVar73 & -(ushort)((short)uVar48 < (short)uStack_2de);
      uVar65 = uVar64 | uVar65 |
               -(ushort)bVar17 & uVar74 & -(ushort)((short)uVar49 < (short)uStack_2dc);
      uVar67 = uVar66 | uVar67 |
               -(ushort)bVar18 & uVar75 & -(ushort)((short)uVar50 < (short)uStack_2da);
      lVar29 = lVar29 + 0x10;
    }
    uVar51 = uVar33 & -(ushort)bVar3 | uVar53 | -(ushort)bVar11 & uVar68;
    uVar33 = uVar36 & -(ushort)bVar4 | uVar55 | -(ushort)bVar12 & uVar69;
    uVar36 = uVar37 & -(ushort)bVar5 | uVar57 | -(ushort)bVar13 & uVar70;
    uVar37 = uVar38 & -(ushort)bVar6 | uVar59 | -(ushort)bVar14 & uVar71;
    uVar38 = uVar39 & -(ushort)bVar7 | uVar61 | -(ushort)bVar15 & uVar72;
    uVar39 = uVar40 & -(ushort)bVar8 | uVar63 | -(ushort)bVar16 & uVar73;
    uVar40 = uVar41 & -(ushort)bVar9 | uVar65 | -(ushort)bVar17 & uVar74;
    uVar41 = uVar42 & -(ushort)bVar10 | uVar67 | -(ushort)bVar18 & uVar75;
    *(ulong *)(__ptr + (long)pbVar30) =
         CONCAT17((0 < (short)uVar41) * ((short)uVar41 < 0x100) * (char)uVar41 -
                  (0xff < (short)uVar41),
                  CONCAT16((0 < (short)uVar40) * ((short)uVar40 < 0x100) * (char)uVar40 -
                           (0xff < (short)uVar40),
                           CONCAT15((0 < (short)uVar39) * ((short)uVar39 < 0x100) * (char)uVar39 -
                                    (0xff < (short)uVar39),
                                    CONCAT14((0 < (short)uVar38) * ((short)uVar38 < 0x100) *
                                             (char)uVar38 - (0xff < (short)uVar38),
                                             CONCAT13((0 < (short)uVar37) * ((short)uVar37 < 0x100)
                                                      * (char)uVar37 - (0xff < (short)uVar37),
                                                      CONCAT12((0 < (short)uVar36) *
                                                               ((short)uVar36 < 0x100) *
                                                               (char)uVar36 - (0xff < (short)uVar36)
                                                               ,CONCAT11((0 < (short)uVar33) *
                                                                         ((short)uVar33 < 0x100) *
                                                                         (char)uVar33 -
                                                                         (0xff < (short)uVar33),
                                                                         (0 < (short)uVar51) *
                                                                         ((short)uVar51 < 0x100) *
                                                                         (char)uVar51 -
                                                                         (0xff < (short)uVar51))))))
                          ));
    ppuVar32 = ppuVar32 + 8;
  }
  do {
    if (n <= pbVar28) {
      local_2b8 = 0;
      std::array<unsigned_long,_65UL>::fill(&bucketsize,&local_2b8);
      bVar21 = *__ptr;
      bucketsize._M_elems[bVar21] = bucketsize._M_elems[bVar21] + 1;
      uVar25 = (ulong)bVar21;
      for (uVar22 = 1;
          (uVar23 = n, n != uVar22 &&
          (bVar21 = __ptr[uVar22], uVar23 = uVar22, (byte)uVar25 <= bVar21)); uVar22 = uVar22 + 1) {
        bucketsize._M_elems[bVar21] = bucketsize._M_elems[bVar21] + 1;
        uVar25 = (ulong)bVar21;
      }
      for (; uVar23 < n; uVar23 = uVar23 + 1) {
        bucketsize._M_elems[__ptr[uVar23]] = bucketsize._M_elems[__ptr[uVar23]] + 1;
      }
      if (uVar22 < n) {
        __src = malloc(n * 8);
        multikey_multipivot<unsigned_short,_32U>::bucketindex._M_elems[0] = 0;
        uVar26 = 0;
        for (lVar29 = 0; lVar29 != 0x40; lVar29 = lVar29 + 1) {
          uVar26 = uVar26 + bucketsize._M_elems[lVar29];
          multikey_multipivot<unsigned_short,_32U>::bucketindex._M_elems[lVar29 + 1] = uVar26;
        }
        for (sVar24 = 0; n != sVar24; sVar24 = sVar24 + 1) {
          puVar2 = strings[sVar24];
          uVar26 = multikey_multipivot<unsigned_short,_32U>::bucketindex._M_elems[__ptr[sVar24]];
          multikey_multipivot<unsigned_short,_32U>::bucketindex._M_elems[__ptr[sVar24]] = uVar26 + 1
          ;
          *(uchar **)((long)__src + uVar26 * 8) = puVar2;
        }
        memcpy(strings,__src,n * 8);
        free(__src);
      }
      free(__ptr);
      sVar24 = CONCAT62(bucketsize._M_elems[0]._2_6_,(ushort)bucketsize._M_elems[0]);
      if (sVar24 != 0) {
        multikey_multipivot<unsigned_short,32u>(strings,sVar24,depth);
      }
      lVar29 = 0;
      do {
        if (lVar29 == 0x1f) {
          if (bucketsize._M_elems[0x3f] != 0) {
            local_2e8 = (char)pivots._M_elems[0x1f];
            if (local_2e8 != '\0') {
              multikey_multipivot<unsigned_short,32u>
                        (strings + sVar24,bucketsize._M_elems[0x3f],depth + 2);
            }
            sVar24 = sVar24 + bucketsize._M_elems[0x3f];
          }
          if (bucketsize._M_elems[0x40] != 0) {
            multikey_multipivot<unsigned_short,32u>
                      (strings + sVar24,bucketsize._M_elems[0x40],depth);
          }
          std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                    (&sample_array.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
          std::
          _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
          ::~_Rb_tree(&sample._M_t);
          return;
        }
        n_00 = bucketsize._M_elems[lVar29 * 2 + 1];
        if ((n_00 != 0) && ((char)pivots._M_elems[lVar29] != '\0')) {
          multikey_multipivot<unsigned_short,32u>(strings + sVar24,n_00,depth + 2);
        }
        n_01 = bucketsize._M_elems[lVar29 * 2 + 2];
        if (n_01 != 0) {
          uVar1 = pivots._M_elems[lVar29];
          if (uVar1 == pivots._M_elems[lVar29 + 1]) {
            __assert_fail("a != b",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                          ,0x57,"unsigned int lcp(uint16_t, uint16_t)");
          }
          multikey_multipivot<unsigned_short,32u>
                    (strings + n_00 + sVar24,n_01,
                     ((uVar1 & 0xff00) == (pivots._M_elems[lVar29 + 1] & 0xff00) &&
                     (uVar1 & 0xff00) != 0) + depth);
        }
        lVar29 = lVar29 + 1;
        sVar24 = n_01 + n_00 + sVar24;
      } while( true );
    }
    uVar20 = get_char<unsigned_short>(strings[(long)pbVar28],depth);
    if (uVar20 < pivots._M_elems[0]) {
      __ptr[(long)pbVar28] = 0;
    }
    else {
      bVar21 = 1;
      for (lVar29 = 2; lVar29 != 0x40; lVar29 = lVar29 + 2) {
        uVar1 = *(ushort *)((long)pivots._M_elems + lVar29 + -2);
        if (uVar20 == uVar1) {
          __ptr[(long)pbVar28] = bVar21;
          goto LAB_001fc61a;
        }
        if ((uVar1 < uVar20) && (uVar20 < *(ushort *)((long)pivots._M_elems + lVar29))) {
          __ptr[(long)pbVar28] = (byte)lVar29;
          goto LAB_001fc61a;
        }
        bVar21 = bVar21 + 2;
      }
      if (uVar20 == pivots._M_elems[0x1f]) {
        __ptr[(long)pbVar28] = 0x3f;
      }
      else {
        __ptr[(long)pbVar28] = 0x40;
      }
    }
LAB_001fc61a:
    pbVar28 = pbVar28 + 1;
  } while( true );
}

Assistant:

static void
multikey_multipivot(unsigned char** strings, size_t n, size_t depth)
{
	static_assert(Pivots > 0, "Pivots must be non-zero");
	static_assert(total_buckets(Pivots) < 0x100, "total number of bucket must be max 255");
	if (n < 15000) {
		mkqsort(strings, n, depth);
		return;
	}
	// TODO: collect frequencies to gain knowledge about distribution
	std::set<CharT> sample;
	for (unsigned i=0; i < Pivots; ++i) {
		double r=drand48();
		size_t pos = ((size_t)((n-7)*r));
		assert(pos+6 < n);
		std::array<CharT, 7> tmp;
		for (unsigned j=0;j<tmp.size();++j) {
			tmp[j] = get_char<CharT>(strings[pos+j], depth);
		}
		sample.insert(tmp.begin(), tmp.end());
	}
	// We _must_ select enough pivots -> insert junk.
	for (CharT i=1; sample.size() < Pivots; ++i) {
		if (is_end(i)) ++i;
		sample.insert(i);
	}
	// Pick pivots from the sample.
	std::vector<CharT> sample_array(sample.begin(), sample.end());
	sample.clear();
	std::array<CharT, Pivots> pivots;
	unsigned step = sample_array.size() / Pivots;
	assert(step > 0);
	for (unsigned i=0; i < Pivots; ++i) {
		pivots[i] = sample_array[step*i];
	}
	uint8_t* restrict oracle = static_cast<uint8_t*>(_mm_malloc(n, 16));
	fill_oracle<Pivots>(strings, n, oracle, pivots, depth);
	std::array<size_t, total_buckets(Pivots)> bucketsize;
	bucketsize.fill(0);
	uint8_t prev = oracle[0];
	bool sorted = true;
	size_t i=1;
	++bucketsize[prev];
	for (; i < n; ++i) {
		uint8_t bucket = oracle[i];
		if (prev > bucket) {
			sorted = false; break;
		}
		++bucketsize[bucket];
		prev = bucket;
	}
	for (; i < n; ++i)
		++bucketsize[oracle[i]];
	if (not sorted) {
		unsigned char** sorted = (unsigned char**)
			malloc(n*sizeof(unsigned char*));
		static std::array<size_t, total_buckets(Pivots)> bucketindex;
		bucketindex[0] = 0;
		for (unsigned i=1; i < total_buckets(Pivots); ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < n; ++i)
			sorted[bucketindex[oracle[i]]++] = strings[i];
		memcpy(strings, sorted, n*sizeof(unsigned char*));
		free(sorted);
	}
	_mm_free(oracle);
	size_t b=0;
	size_t bsum = bucketsize[0];
	if (bsum) multikey_multipivot<CharT, Pivots>(strings, bsum, depth);
	for (unsigned i=0; i < Pivots-1; ++i) {
		b = bucketsize[middle_bucket(i)];
		if (b and not is_end(pivots[i])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
					depth+sizeof(CharT));
		}
		bsum += b;
		if ((b = bucketsize[right_bucket(i)])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
				depth+lcp(pivots[i], pivots[i+1]));
		}
		bsum += b;
	}
	if ((b = bucketsize[middle_bucket(Pivots-1)])) {
		if (not is_end(pivots[Pivots-1]))
			multikey_multipivot<CharT, Pivots>(strings+bsum,
				b, depth+sizeof(CharT));
		bsum += b;
	}
	if ((b = bucketsize[right_bucket(Pivots-1)])) {
		multikey_multipivot<CharT, Pivots>(strings+bsum, b, depth);
	}
}